

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O2

void freetypeinfo(MOJOSHADER_symbolTypeInfo *typeinfo,MOJOSHADER_free f,void *d)

{
  int i;
  ulong uVar1;
  long lVar2;
  
  lVar2 = 8;
  for (uVar1 = 0; uVar1 < typeinfo->member_count; uVar1 = uVar1 + 1) {
    (*f)(*(void **)((long)typeinfo->members + lVar2 + -8),d);
    freetypeinfo((MOJOSHADER_symbolTypeInfo *)((long)&typeinfo->members->name + lVar2),f,d);
    lVar2 = lVar2 + 0x28;
  }
  (*f)(typeinfo->members,d);
  return;
}

Assistant:

void freetypeinfo(MOJOSHADER_symbolTypeInfo *typeinfo,
                  MOJOSHADER_free f, void *d)
{
    int i;
    for (i = 0; i < typeinfo->member_count; i++)
    {
        f((void *) typeinfo->members[i].name, d);
        freetypeinfo(&typeinfo->members[i].info, f, d);
    } // for
    f((void *) typeinfo->members, d);
}